

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

void __thiscall XMISong::DoRestart(XMISong *this)

{
  TrackInfo *pTVar1;
  DWORD DVar2;
  EventSource EVar3;
  
  pTVar1 = this->CurrSong;
  pTVar1->EventP = 0;
  pTVar1->Finished = false;
  pTVar1->PlayedTime = 0;
  pTVar1->ForDepth = 0;
  TArray<AutoNoteOff,_AutoNoteOff>::Clear(&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>);
  ProcessInitialMetaEvents(this);
  DVar2 = TrackInfo::ReadDelay(this->CurrSong);
  this->CurrSong->Delay = DVar2;
  EVar3 = FindNextDue(this);
  this->EventDue = EVar3;
  return;
}

Assistant:

void XMISong::DoRestart()
{
	CurrSong->EventP = 0;
	CurrSong->Finished = false;
	CurrSong->PlayedTime = 0;
	CurrSong->ForDepth = 0;
	NoteOffs.Clear();

	ProcessInitialMetaEvents ();

	CurrSong->Delay = CurrSong->ReadDelay();
	EventDue = FindNextDue();
}